

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_primitives.h
# Opt level: O0

int int_of_substring(substring s)

{
  long lVar1;
  ostream *poVar2;
  char *pcVar3;
  char *in_RSI;
  char *in_RDI;
  int i;
  char *endptr;
  allocator local_41;
  string local_40 [36];
  int local_1c;
  char *local_18;
  char *local_10;
  char *local_8;
  
  local_18 = in_RSI;
  local_10 = in_RDI;
  local_8 = in_RSI;
  lVar1 = strtol(in_RDI,&local_18,10);
  local_1c = (int)lVar1;
  if ((local_18 == local_10) && (local_10 != local_8)) {
    poVar2 = std::operator<<((ostream *)&std::cout,"warning: ");
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_40,local_10,(long)local_8 - (long)local_10,&local_41);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    poVar2 = std::operator<<(poVar2,pcVar3);
    poVar2 = std::operator<<(poVar2," is not a good int, replacing with 0");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string(local_40);
    std::allocator<char>::~allocator((allocator<char> *)&local_41);
    local_1c = 0;
  }
  return local_1c;
}

Assistant:

inline int int_of_substring(substring s)
{
  char* endptr = s.end;
  int i = strtol(s.begin, &endptr, 10);
  if (endptr == s.begin && s.begin != s.end)
  {
    std::cout << "warning: " << std::string(s.begin, s.end - s.begin).c_str() << " is not a good int, replacing with 0"
              << std::endl;
    i = 0;
  }

  return i;
}